

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCallsOf(LazyLLVMCallGraph *this,Function *F)

{
  bool bVar1;
  Use *this_00;
  GenericCallGraph<const_llvm::Function_*> *this_01;
  BasicBlock *this_02;
  Function *a;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *in_RSI;
  Value *in_RDI;
  CallInst *C;
  User *user;
  Use *use;
  use_iterator_impl<const_llvm::Use> __end2;
  use_iterator_impl<const_llvm::Use> __begin2;
  iterator_range<llvm::Value::use_iterator_impl<const_llvm::Use>_> *__range2;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *ret;
  pointer *in_stack_ffffffffffffff78;
  Value *__x;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *in_stack_ffffffffffffffa8
  ;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *in_stack_ffffffffffffffb0
  ;
  Function *in_stack_ffffffffffffffb8;
  use_iterator_impl<const_llvm::Use> local_40;
  iterator_range<llvm::Value::use_iterator_impl<const_llvm::Use>_> local_38;
  iterator_range<llvm::Value::use_iterator_impl<const_llvm::Use>_> *local_28;
  undefined1 local_19;
  
  __x = in_RDI;
  bVar1 = funHasAddressTaken(in_stack_ffffffffffffffb8);
  if (bVar1) {
    getCallsOfAddressTaken((LazyLLVMCallGraph *)use,(Function *)user);
    std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::vector
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    local_19 = 0;
    std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::vector
              ((vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *)0x1cc7b0);
    local_38 = llvm::Value::uses(in_RDI);
    local_28 = &local_38;
    local_40 = llvm::iterator_range<llvm::Value::use_iterator_impl<const_llvm::Use>_>::begin
                         (local_28);
    llvm::iterator_range<llvm::Value::use_iterator_impl<const_llvm::Use>_>::end(local_28);
    while (bVar1 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator!=
                             ((use_iterator_impl<const_llvm::Use> *)in_RDI,
                              (use_iterator_impl<const_llvm::Use> *)in_stack_ffffffffffffff78),
          bVar1) {
      this_00 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator*(&local_40);
      llvm::Use::getUser(this_00);
      this_01 = (GenericCallGraph<const_llvm::Function_*> *)
                llvm::cast<llvm::CallInst,llvm::User>((User *)0x1cc82c);
      in_stack_ffffffffffffff78 =
           &(in_RSI->
            super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
      this_02 = llvm::Instruction::getParent((Instruction *)this_01);
      a = llvm::BasicBlock::getParent(this_02);
      GenericCallGraph<const_llvm::Function_*>::addCall(this_01,(Function **)a,(Function **)in_RSI);
      std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::push_back
                (in_RSI,(value_type *)__x);
      llvm::Value::use_iterator_impl<const_llvm::Use>::operator++
                ((use_iterator_impl<const_llvm::Use> *)in_RDI);
    }
  }
  return (vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *)__x;
}

Assistant:

std::vector<const llvm::CallInst *> getCallsOf(const llvm::Function *F) {
        if (funHasAddressTaken(F)) {
            return getCallsOfAddressTaken(F);
        }

        // has not address taken, so all users are calls
        std::vector<const llvm::CallInst *> ret;
        for (auto &use : F->uses()) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
            auto *user = *use;
#else
            auto *user = use.getUser();
#endif
            auto *C = llvm::cast<llvm::CallInst>(user);
            _cg.addCall(C->getParent()->getParent(), F);
            ret.push_back(C);
        }
        return ret;
    }